

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovProgram.cpp
# Opt level: O0

void __thiscall
cov::Program::Program
          (Program *this,Context *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sources_local;
  Context *context_local;
  Program *this_local;
  
  ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>::ClObject
            (&this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>);
  this->m_context = context;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_sources,sources);
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess = true;
  if (((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess & 1U) != 0) {
    ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::retain
              (&this->m_context->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>);
  }
  return;
}

Assistant:

Program::Program(Context& context, std::vector<std::string>& sources)
    : m_context(context),
      m_sources(std::move(sources))
{
    m_initSuccess = true; // fixme
    if (m_initSuccess) m_context.retain();
}